

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logging.cpp
# Opt level: O0

void __thiscall
Logging::logValue(Logging *this,long populationID,int neuronID,int valueType,double value)

{
  vector<double,_std::allocator<double>_> *in_RDI;
  vector<double,_std::allocator<double>_> *in_XMM0_Qa;
  value_type_conflict3 *__x;
  pointer *__x_00;
  
  __x_00 = &in_RDI[4].super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish;
  __x = (value_type_conflict3 *)
        Clock::getCurrentTime
                  ((Clock *)(in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                            super__Vector_impl_data._M_start);
  std::vector<double,_std::allocator<double>_>::push_back(in_RDI,(value_type_conflict3 *)__x_00);
  std::vector<long,_std::allocator<long>_>::push_back
            ((vector<long,_std::allocator<long>_> *)in_XMM0_Qa,(value_type_conflict4 *)__x);
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)in_XMM0_Qa,(value_type_conflict1 *)__x);
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)in_XMM0_Qa,(value_type_conflict1 *)__x);
  std::vector<double,_std::allocator<double>_>::push_back(in_XMM0_Qa,__x);
  return;
}

Assistant:

void Logging::logValue(long populationID, int neuronID, int valueType, double value) {
    value_time.push_back(clock->getCurrentTime());
    value_populationID.push_back(populationID);
    value_neuronID.push_back(neuronID);
    value_valueType.push_back(valueType);
    value_value.push_back(value);
}